

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::StringLifting::run::StringApplier::create(StringApplier *this)

{
  _func_int **local_20;
  
  std::
  make_unique<wasm::StringLifting::run(wasm::Module*)::StringApplier,wasm::StringLifting_const&>
            ((StringLifting *)&stack0xffffffffffffffe0);
  (this->super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>).
  super_Pass._vptr_Pass = local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<StringApplier>(parent);
      }